

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

FiniteAutomaton *
Omega_h::FiniteAutomaton::simplify_once(FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *fa)

{
  mapped_type mVar1;
  key_type kVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  size_type __n;
  size_type sVar6;
  mapped_type *pmVar7;
  __enable_if_t<is_constructible<value_type,_pair<int,_int>_>::value,_pair<iterator,_bool>_> _Var8;
  reference rVar9;
  reference local_118;
  int local_108;
  int local_104;
  int token;
  mapped_type next_simple;
  int next_state;
  int symbol;
  _Bit_type local_f0;
  int local_e4;
  key_type local_e0;
  mapped_type simple_1;
  int state_1;
  vector<bool,_std::allocator<bool>_> did_simple;
  int simple;
  pair<int,_int> local_98;
  _Base_ptr local_90;
  __enable_if_t<is_constructible<value_type,_pair<int,_int>_>::value,_pair<iterator,_bool>_> res;
  int local_78;
  int state;
  int nsimple;
  allocator<std::pair<const_int,_int>_> local_61;
  StateRowLess local_60;
  undefined1 local_50 [8];
  StateRow2SimpleState sr2ss;
  FiniteAutomaton *fa_local;
  FiniteAutomaton *out;
  
  local_60.accepted = &fa->accepted_tokens;
  local_60.table = &fa->table;
  sr2ss._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)fa;
  std::allocator<std::pair<const_int,_int>_>::allocator(&local_61);
  std::map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_50,&local_60,&local_61);
  std::allocator<std::pair<const_int,_int>_>::~allocator(&local_61);
  local_78 = 0;
  for (res._12_4_ = 0; uVar3 = res._12_4_,
      iVar5 = get_nstates((FiniteAutomaton *)sr2ss._M_t._M_impl.super__Rb_tree_header._M_node_count)
      , (int)uVar3 < iVar5; res._12_4_ = res._12_4_ + 1) {
    local_98 = std::make_pair<int&,int&>((int *)&res.field_0xc,&local_78);
    _Var8 = std::map<int,int,Omega_h::StateRowLess,std::allocator<std::pair<int_const,int>>>::
            insert<std::pair<int,int>>
                      ((map<int,int,Omega_h::StateRowLess,std::allocator<std::pair<int_const,int>>>
                        *)local_50,&local_98);
    local_90 = (_Base_ptr)_Var8.first._M_node;
    res.first._M_node._0_1_ = _Var8.second;
    if (((undefined1  [16])_Var8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_78 = local_78 + 1;
    }
  }
  did_simple.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  iVar5 = get_nsymbols((FiniteAutomaton *)sr2ss._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar4 = get_determinism((FiniteAutomaton *)sr2ss._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  FiniteAutomaton(__return_storage_ptr__,iVar5,bVar4,local_78);
  for (did_simple.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)did_simple.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage < local_78;
      did_simple.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)did_simple.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage + 1) {
    add_state(__return_storage_ptr__);
  }
  __n = (size_type)local_78;
  simple_1._3_1_ = 0;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&simple_1 + 2));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&state_1,__n,(bool *)((long)&simple_1 + 3),
             (allocator<bool> *)((long)&simple_1 + 2));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&simple_1 + 2));
  local_e0 = 0;
  while( true ) {
    kVar2 = local_e0;
    iVar5 = get_nstates((FiniteAutomaton *)sr2ss._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (iVar5 <= kVar2) {
      did_simple.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._7_1_ = 1;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)&state_1);
      if ((did_simple.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage._7_1_ & 1) == 0) {
        ~FiniteAutomaton(__return_storage_ptr__);
      }
      std::map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                  *)local_50);
      return __return_storage_ptr__;
    }
    sVar6 = std::map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>::
            count((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_50,&local_e0);
    if (sVar6 == 0) break;
    pmVar7 = std::map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[]((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_50,&local_e0);
    local_e4 = *pmVar7;
    rVar9 = at<bool>((vector<bool,_std::allocator<bool>_> *)&state_1,local_e4);
    _next_state = rVar9;
    bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&next_state);
    if (!bVar4) {
      next_simple = 0;
      while( true ) {
        mVar1 = next_simple;
        iVar5 = get_nsymbols_eps((FiniteAutomaton *)
                                 sr2ss._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (iVar5 <= mVar1) break;
        token = step((FiniteAutomaton *)sr2ss._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     local_e0,next_simple);
        if (token != -1) {
          sVar6 = std::
                  map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                  ::count((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_50,&token);
          if (sVar6 == 0) {
            fail("assertion %s failed at %s +%d\n","sr2ss.count(next_state)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
                 ,0x164);
          }
          pmVar7 = std::
                   map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                   ::operator[]((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                                 *)local_50,&token);
          local_104 = *pmVar7;
          add_transition(__return_storage_ptr__,local_e4,next_simple,local_104);
        }
        next_simple = next_simple + 1;
      }
      local_108 = accepts((FiniteAutomaton *)sr2ss._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          local_e0);
      if (local_108 != -1) {
        add_accept(__return_storage_ptr__,local_e4,local_108);
      }
      rVar9 = at<bool>((vector<bool,_std::allocator<bool>_> *)&state_1,local_e4);
      local_118 = rVar9;
      std::_Bit_reference::operator=(&local_118,true);
    }
    local_e0 = local_e0 + 1;
  }
  fail("assertion %s failed at %s +%d\n","sr2ss.count(state)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,0x15e);
}

Assistant:

FiniteAutomaton FiniteAutomaton::simplify_once(FiniteAutomaton const& fa) {
  StateRow2SimpleState sr2ss({fa.table, fa.accepted_tokens});
  int nsimple = 0;
  for (int state = 0; state < get_nstates(fa); ++state) {
    auto res = sr2ss.insert(std::make_pair(state, nsimple));
    if (res.second) {
      ++nsimple;
    }
  }
  FiniteAutomaton out(get_nsymbols(fa), get_determinism(fa), nsimple);
  for (int simple = 0; simple < nsimple; ++simple) {
    add_state(out);
  }
  std::vector<bool> did_simple(size_t(nsimple), false);
  for (int state = 0; state < get_nstates(fa); ++state) {
    OMEGA_H_CHECK(sr2ss.count(state));
    auto simple = sr2ss[state];
    if (at(did_simple, simple)) continue;
    for (int symbol = 0; symbol < get_nsymbols_eps(fa); ++symbol) {
      auto next_state = step(fa, state, symbol);
      if (next_state == -1) continue;
      OMEGA_H_CHECK(sr2ss.count(next_state));
      auto next_simple = sr2ss[next_state];
      add_transition(out, simple, symbol, next_simple);
    }
    auto token = accepts(fa, state);
    if (token != -1) {
      add_accept(out, simple, token);
    }
    at(did_simple, simple) = true;
  }
  return out;
}